

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

void syms_add(sym_t *s)

{
  symtbl_t *psVar1;
  sym_t **ppsVar2;
  uint uVar3;
  
  if (s->id[0] != '\0') {
    if (s->type_id == 0) {
      s->type_id = 0x80;
    }
    psVar1 = scope;
    uVar3 = scope->num_syms + 1;
    scope->num_syms = uVar3;
    ppsVar2 = (sym_t **)mrealloc(psVar1->syms,(ulong)uVar3 << 3);
    psVar1 = scope;
    scope->syms = ppsVar2;
    ppsVar2[psVar1->num_syms - 1] = s;
    return;
  }
  free(s);
  return;
}

Assistant:

void syms_add(sym_t* s)
{
    int i;
    /* empty declaration like 'static byte;' */
    if (s->id[0] == 0)
    {
        free(s);
        return;
    }

    /* set default type */
    if (!s->type_id)
        s->type_id = BYTE;

    /* check for redefinition
    for (i = 0; i < scope->num_syms; ++i)
    {
        if (strcmp(s->id, scope->syms[i]->id) == 0)
        {
            err(E, "redefinition of '%s'", s->id);
            return;
        }
    }
    */

    scope->num_syms++;
    scope->syms = (sym_t**)mrealloc(scope->syms,
                                   sizeof(sym_t*) * scope->num_syms);
    scope->syms[scope->num_syms - 1] = s;


}